

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

void unqlite_start(void)

{
  int iVar1;
  unqlite_vfs *puVar2;
  char *failPageSzMsg;
  char *failVfsMsg;
  int rc;
  
  puVar2 = unqliteExportDemoVfs();
  iVar1 = unqlite_lib_config(6,puVar2);
  if (iVar1 != 0) {
    puts("Error in VFS configuration");
    exit(0);
  }
  iVar1 = unqlite_lib_config(8,0x200);
  if (iVar1 != 0) {
    puts("Error in setting PageSize");
    exit(0);
  }
  return;
}

Assistant:

static void unqlite_start(void) {
	
	int rc;
	const char *failVfsMsg = "Error in VFS configuration";
	const char *failPageSzMsg = "Error in setting PageSize";
	/* configure this vfs as the current one (unqlite supports just one VFS at a time) */
	rc = unqlite_lib_config(UNQLITE_LIB_CONFIG_VFS, unqliteExportDemoVfs());
	if( rc!=UNQLITE_OK ){
		puts(failVfsMsg);
		exit(0);
	}
	/* set the page size */
	rc = unqlite_lib_config(UNQLITE_LIB_CONFIG_PAGE_SIZE, UNQLITE_PAGE_SIZE);
	if( rc!=UNQLITE_OK ){
		puts(failPageSzMsg);
		exit(0);
	}
	
}